

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall tlx::CmdlineParser::print_usage(CmdlineParser *this,ostream *os)

{
  undefined4 uVar1;
  Argument *pAVar2;
  long lVar3;
  ostream *poVar4;
  char cVar5;
  char *pcVar6;
  size_t sVar7;
  pointer ppAVar8;
  bool bVar9;
  string local_50;
  
  uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  poVar4 = std::operator<<(os,"Usage: ");
  poVar4 = std::operator<<(poVar4,this->program_name_);
  pcVar6 = " [options]";
  if ((this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar6 = "";
  }
  std::operator<<(poVar4,pcVar6);
  for (ppAVar8 = (this->param_list_).
                 super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppAVar8 !=
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppAVar8 = ppAVar8 + 1) {
    pAVar2 = *ppAVar8;
    pcVar6 = " <";
    if (pAVar2->required_ == false) {
      pcVar6 = " [";
    }
    poVar4 = std::operator<<(os,pcVar6);
    poVar4 = std::operator<<(poVar4,(string *)&pAVar2->longkey_);
    pcVar6 = " ...";
    if (pAVar2->repeated_ == false) {
      pcVar6 = "";
    }
    poVar4 = std::operator<<(poVar4,pcVar6);
    cVar5 = '>';
    if (pAVar2->required_ == false) {
      cVar5 = ']';
    }
    std::operator<<(poVar4,cVar5);
  }
  std::endl<char,std::char_traits<char>>(os);
  if ((this->description_)._M_string_length != 0) {
    std::endl<char,std::char_traits<char>>(os);
    output_wrap(os,&this->description_,(ulong)this->line_wrap_,0,0,0,0);
  }
  if ((this->author_)._M_string_length == 0) {
    bVar9 = true;
  }
  else {
    poVar4 = std::operator<<(os,"Author: ");
    poVar4 = std::operator<<(poVar4,(string *)&this->author_);
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar9 = (this->author_)._M_string_length == 0;
  }
  if (((this->description_)._M_string_length != 0) || (!bVar9)) {
    std::endl<char,std::char_traits<char>>(os);
  }
  if ((this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar4 = std::operator<<(os,"Parameters:");
    std::endl<char,std::char_traits<char>>(poVar4);
    for (ppAVar8 = (this->param_list_).
                   super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppAVar8 !=
        (this->param_list_).
        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppAVar8 = ppAVar8 + 1) {
      pAVar2 = *ppAVar8;
      poVar4 = std::operator<<(os,"  ");
      lVar3 = *(long *)poVar4;
      *(long *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = (long)(int)this->param_max_width_;
      lVar3 = *(long *)(lVar3 + -0x18);
      *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffff4f | 0x20;
      Argument::param_text_abi_cxx11_(&local_50,pAVar2);
      std::operator<<(poVar4,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      sVar7 = this->param_max_width_ + 2;
      output_wrap(os,&pAVar2->desc_,(ulong)this->line_wrap_,0,sVar7,sVar7,8);
    }
  }
  if ((this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar4 = std::operator<<(os,"Options:");
    std::endl<char,std::char_traits<char>>(poVar4);
    for (ppAVar8 = (this->option_list_).
                   super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppAVar8 !=
        (this->option_list_).
        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppAVar8 = ppAVar8 + 1) {
      pAVar2 = *ppAVar8;
      poVar4 = std::operator<<(os,"  ");
      lVar3 = *(long *)poVar4;
      *(long *)(poVar4 + *(long *)(lVar3 + -0x18) + 0x10) = (long)(int)this->option_max_width_;
      lVar3 = *(long *)(lVar3 + -0x18);
      *(uint *)(poVar4 + lVar3 + 0x18) = *(uint *)(poVar4 + lVar3 + 0x18) & 0xffffff4f | 0x20;
      Argument::option_text_abi_cxx11_(&local_50,pAVar2);
      std::operator<<(poVar4,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      sVar7 = this->option_max_width_ + 2;
      output_wrap(os,&pAVar2->desc_,(ulong)this->line_wrap_,0,sVar7,sVar7,8);
    }
  }
  *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
  return;
}

Assistant:

void CmdlineParser::print_usage(std::ostream& os) {
    std::ios::fmtflags flags(os.flags());

    os << "Usage: " << program_name_
       << (!option_list_.empty() ? " [options]" : "");

    for (ArgumentList::const_iterator it = param_list_.begin();
         it != param_list_.end(); ++it) {
        const Argument* arg = *it;

        os << (arg->required_ ? " <" : " [") << arg->longkey_
           << (arg->repeated_ ? " ..." : "") << (arg->required_ ? '>' : ']');
    }

    os << std::endl;

    if (!description_.empty()) {
        os << std::endl;
        output_wrap(os, description_, line_wrap_);
    }
    if (!author_.empty()) {
        os << "Author: " << author_ << std::endl;
    }

    if (!description_.empty() || !author_.empty())
        os << std::endl;

    if (!param_list_.empty()) {
        os << "Parameters:" << std::endl;

        for (ArgumentList::const_iterator it = param_list_.begin();
             it != param_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(param_max_width_))
               << std::left << arg->param_text();
            output_wrap(os, arg->desc_, line_wrap_, 0, param_max_width_ + 2,
                        param_max_width_ + 2, 8);
        }
    }

    if (!option_list_.empty()) {
        os << "Options:" << std::endl;

        for (ArgumentList::const_iterator it = option_list_.begin();
             it != option_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(option_max_width_))
               << std::left << arg->option_text();
            output_wrap(os, arg->desc_, line_wrap_, 0, option_max_width_ + 2,
                        option_max_width_ + 2, 8);
        }
    }

    os.flags(flags);
}